

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O0

void __thiscall qclab::qgates::CZ<float>::CZ(CZ<float> *this)

{
  CZ<float> *this_local;
  
  QControlledGate2<float>::QControlledGate2(&this->super_QControlledGate2<float>,0,1);
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00759fb8;
  std::make_unique<qclab::qgates::PauliZ<float>,int>((int *)&this->gate_);
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }